

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Scene::~Scene(Scene *this)

{
  XFormWidget *pXVar1;
  pointer pVVar2;
  
  pXVar1 = this->elementTransform;
  if (pXVar1 != (XFormWidget *)0x0) {
    (pXVar1->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_002717f8;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector(&pXVar1->axisColors);
    pVVar2 = (pXVar1->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pVVar2 != (pointer)0x0) {
      operator_delete(pVVar2);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>,_std::_Select1st<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>_>
    ::~_Rb_tree(&(pXVar1->pickIDToAxis)._M_t);
    (pXVar1->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR___cxa_pure_virtual_002716f0;
    std::
    _Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
    ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
                 *)&(pXVar1->super_SceneObject).scales);
    std::
    _Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
    ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
                 *)&(pXVar1->super_SceneObject).rotations);
    std::
    _Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
    ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
                 *)&(pXVar1->super_SceneObject).positions);
    operator_delete(pXVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->selectionInfo);
  std::
  _Rb_tree<CMU462::DynamicScene::SceneLight_*,_CMU462::DynamicScene::SceneLight_*,_std::_Identity<CMU462::DynamicScene::SceneLight_*>,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  ::~_Rb_tree(&(this->lights)._M_t);
  std::
  _Rb_tree<CMU462::DynamicScene::SceneObject_*,_CMU462::DynamicScene::SceneObject_*,_std::_Identity<CMU462::DynamicScene::SceneObject_*>,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::~_Rb_tree(&(this->objects)._M_t);
  return;
}

Assistant:

Scene::~Scene() {
  if (elementTransform != nullptr) {
    delete elementTransform;
  }
}